

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.c
# Opt level: O1

void ptmr_stop(ptmr_t *tm)

{
  double dVar1;
  double dVar2;
  timeval e_stop;
  rusage stop;
  timeval local_b0;
  rusage local_a0;
  
  getrusage(RUSAGE_SELF,&local_a0);
  dVar1 = ((double)local_a0.ru_stime.tv_usec * 1e-06 + (double)local_a0.ru_stime.tv_sec +
          (double)local_a0.ru_utime.tv_usec * 1e-06 + (double)local_a0.ru_utime.tv_sec) -
          (double)tm->start_cpu;
  gettimeofday(&local_b0,(__timezone_ptr_t)0x0);
  dVar2 = ((double)local_b0.tv_usec * 1e-06 + (double)local_b0.tv_sec) - (double)tm->start_elapsed;
  tm->t_cpu = (float64)((double)tm->t_cpu + dVar1);
  tm->t_elapsed = (float64)((double)tm->t_elapsed + dVar2);
  tm->t_tot_cpu = (float64)(dVar1 + (double)tm->t_tot_cpu);
  tm->t_tot_elapsed = (float64)(dVar2 + (double)tm->t_tot_elapsed);
  return;
}

Assistant:

void
ptmr_stop(ptmr_t * tm)
{
    float64 dt_cpu, dt_elapsed;

#if (! defined(_WIN32)) || defined(GNUWINCE) || defined(__SYMBIAN32__)
    struct timeval e_stop;      /* Elapsed time */

#if (! defined(_HPUX_SOURCE))  && (! defined(__SYMBIAN32__))
    struct rusage stop;         /* CPU time */

    /* Unix but not HPUX */
    getrusage(RUSAGE_SELF, &stop);
    dt_cpu =
        make_sec(&stop.ru_utime) + make_sec(&stop.ru_stime) -
        tm->start_cpu;
#else
    dt_cpu = 0.0;
#endif
    /* Unix + HP */
    gettimeofday(&e_stop, 0);
    dt_elapsed = (make_sec(&e_stop) - tm->start_elapsed);
#elif defined(_WIN32_WP)
    dt_cpu = GetTickCount64() / 1000 - tm->start_cpu;
    dt_elapsed = GetTickCount64() / 1000 - tm->start_elapsed;
#elif defined(_WIN32_WCE)
    /* No GetProcessTimes() on WinCE.  (Note CPU time will be bogus) */
    dt_cpu = GetTickCount() / 1000 - tm->start_cpu;
    dt_elapsed = GetTickCount() / 1000 - tm->start_elapsed;
#else
    HANDLE pid;
    FILETIME t_create, t_exit, kst, ust;

    /* PC */
    pid = GetCurrentProcess();
    GetProcessTimes(pid, &t_create, &t_exit, &kst, &ust);
    dt_cpu = make_sec(&ust) + make_sec(&kst) - tm->start_cpu;
    dt_elapsed = ((float64) clock() / CLOCKS_PER_SEC) - tm->start_elapsed;
#endif

    tm->t_cpu += dt_cpu;
    tm->t_elapsed += dt_elapsed;

    tm->t_tot_cpu += dt_cpu;
    tm->t_tot_elapsed += dt_elapsed;
}